

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O3

void __thiscall
bssl::HPKETest_RecipientInvalidSeal_Test::TestBody(HPKETest_RecipientInvalidSeal_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  char *in_R9;
  char *pcVar2;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  size_t ciphertext_len;
  char kCleartextPayload [7];
  uint8_t ciphertext [100];
  uint8_t kMockEnc [32];
  ScopedEVP_HPKE_KEY key;
  ScopedEVP_HPKE_CTX recipient_ctx;
  AssertHelper local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  AssertHelper local_418;
  undefined1 local_410 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  AssertHelper local_3f0;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  uint8_t local_3e0 [8];
  undefined1 local_3d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8 [6];
  uint8_t local_368 [32];
  EVP_HPKE_KEY local_348;
  undefined1 local_2d8 [16];
  EVP_HPKE_KEM local_2c8 [7];
  
  local_368[0x10] = '\0';
  local_368[0x11] = '\0';
  local_368[0x12] = '\0';
  local_368[0x13] = '\0';
  local_368[0x14] = '\0';
  local_368[0x15] = '\0';
  local_368[0x16] = '\0';
  local_368[0x17] = '\0';
  local_368[0x18] = '\0';
  local_368[0x19] = '\0';
  local_368[0x1a] = '\0';
  local_368[0x1b] = '\0';
  local_368[0x1c] = '\0';
  local_368[0x1d] = '\0';
  local_368[0x1e] = '\0';
  local_368[0x1f] = '\0';
  local_368[0] = 0xff;
  local_368[1] = '\0';
  local_368[2] = '\0';
  local_368[3] = '\0';
  local_368[4] = '\0';
  local_368[5] = '\0';
  local_368[6] = '\0';
  local_368[7] = '\0';
  local_368[8] = '\0';
  local_368[9] = '\0';
  local_368[10] = '\0';
  local_368[0xb] = '\0';
  local_368[0xc] = '\0';
  local_368[0xd] = '\0';
  local_368[0xe] = '\0';
  local_368[0xf] = '\0';
  builtin_memcpy(local_3e0,"foobar",7);
  EVP_HPKE_KEY_zero(&local_348);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar1 = EVP_HPKE_KEY_generate(&local_348,kem);
  local_3d8[0] = (internal)(iVar1 != 0);
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)local_3d8,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_428,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x212,(char *)local_2d8._0_8_);
    testing::internal::AssertHelper::operator=(&local_428,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_428);
    if ((EVP_HPKE_KEM *)local_2d8._0_8_ != local_2c8) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0]._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_410._1_7_,local_410[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_410._1_7_,local_410[0]) + 8))();
    }
    if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3d0,local_3d0);
    }
    goto LAB_003022a1;
  }
  EVP_HPKE_CTX_zero((EVP_HPKE_CTX *)local_2d8);
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  pcVar2 = &DAT_00000020;
  iVar1 = EVP_HPKE_CTX_setup_recipient
                    ((EVP_HPKE_CTX *)local_2d8,&local_348,kdf,aead,local_368,0x20,(uint8_t *)0x0,0);
  local_410[0] = (internal)(iVar1 != 0);
  local_408 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_408;
    testing::Message::Message((Message *)&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3d8,(internal *)local_410,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_recipient( recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), kMockEnc, sizeof(kMockEnc), nullptr, 0)"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x218,(char *)CONCAT71(local_3d8._1_7_,local_3d8[0]));
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_3d8._1_7_,local_3d8[0]) != local_3c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_3d8._1_7_,local_3d8[0]),
                      local_3c8[0]._M_allocated_capacity + 1);
    }
    __ptr_00 = local_408;
    if ((long *)CONCAT71(local_428.data_._1_7_,local_428.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_428.data_._1_7_,local_428.data_._0_1_) + 8))();
      __ptr_00 = local_408;
    }
LAB_00302287:
    if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,__ptr_00);
    }
  }
  else {
    pcVar2 = &DAT_00000007;
    iVar1 = EVP_HPKE_CTX_seal((EVP_HPKE_CTX *)local_2d8,local_3d8,(size_t *)&local_418,100,local_3e0
                              ,7,(uint8_t *)0x0,0);
    local_428.data_._0_1_ = (internal)(iVar1 == 0);
    local_420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_428.data_._0_1_) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_420;
      testing::Message::Message((Message *)&local_3e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_410,(internal *)&local_428,
                 (AssertionResult *)
                 "EVP_HPKE_CTX_seal( recipient_ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext), reinterpret_cast<const uint8_t *>(kCleartextPayload), sizeof(kCleartextPayload), nullptr, 0)"
                 ,"true","false",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x220,(char *)CONCAT71(local_410._1_7_,local_410[0]));
      testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_3e8);
      testing::internal::AssertHelper::~AssertHelper(&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_410._1_7_,local_410[0]) != &local_400) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_410._1_7_,local_410[0]),
                        local_400._M_allocated_capacity + 1);
      }
      __ptr_00 = local_420;
      if (local_3e8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)local_3e8._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
        __ptr_00 = local_420;
      }
      goto LAB_00302287;
    }
  }
  EVP_HPKE_CTX_cleanup((EVP_HPKE_CTX *)local_2d8);
LAB_003022a1:
  EVP_HPKE_KEY_cleanup(&local_348);
  return;
}

Assistant:

TEST(HPKETest, RecipientInvalidSeal) {
  const uint8_t kMockEnc[X25519_PUBLIC_VALUE_LEN] = {0xff};
  const char kCleartextPayload[] = "foobar";

  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  // Set up the recipient.
  ScopedEVP_HPKE_CTX recipient_ctx;
  ASSERT_TRUE(EVP_HPKE_CTX_setup_recipient(
      recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), kMockEnc, sizeof(kMockEnc), nullptr, 0));

  // Call Seal() on the recipient.
  size_t ciphertext_len;
  uint8_t ciphertext[100];
  ASSERT_FALSE(EVP_HPKE_CTX_seal(
      recipient_ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext),
      reinterpret_cast<const uint8_t *>(kCleartextPayload),
      sizeof(kCleartextPayload), nullptr, 0));
}